

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::MapKeySorter::MapKeyComparator::operator()
          (MapKeyComparator *this,MapKey *a,MapKey *b)

{
  bool bVar1;
  CppType CVar2;
  CppType CVar3;
  int32_t iVar4;
  int32_t iVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  int64_t iVar8;
  int64_t iVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  bool bVar12;
  string_view __x;
  string_view __y;
  LogMessage local_30;
  
  CVar2 = MapKey::type(a);
  CVar3 = MapKey::type(b);
  if (CVar2 != CVar3) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
               ,0x484,"a.type() == b.type()");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_30);
  }
  CVar2 = MapKey::type(a);
  switch(CVar2) {
  case CPPTYPE_INT32:
    iVar4 = MapKey::GetInt32Value(a);
    iVar5 = MapKey::GetInt32Value(b);
    bVar1 = SBORROW4(iVar4,iVar5);
    bVar12 = iVar4 - iVar5 < 0;
    goto LAB_00232cc3;
  case CPPTYPE_INT64:
    iVar8 = MapKey::GetInt64Value(a);
    iVar9 = MapKey::GetInt64Value(b);
    bVar1 = SBORROW8(iVar8,iVar9);
    bVar12 = iVar8 - iVar9 < 0;
LAB_00232cc3:
    bVar12 = bVar1 != bVar12;
    break;
  case CPPTYPE_UINT32:
    uVar6 = MapKey::GetUInt32Value(a);
    uVar7 = MapKey::GetUInt32Value(b);
    bVar12 = uVar6 < uVar7;
    break;
  case CPPTYPE_UINT64:
    uVar10 = MapKey::GetUInt64Value(a);
    uVar11 = MapKey::GetUInt64Value(b);
    bVar12 = uVar10 < uVar11;
    break;
  default:
    absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
               ,0x493);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&local_30,(char (*) [27])"Invalid key for map field.");
    absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_30);
    bVar12 = true;
    break;
  case CPPTYPE_BOOL:
    bVar1 = MapKey::GetBoolValue(a);
    bVar12 = MapKey::GetBoolValue(b);
    bVar12 = !bVar1 && bVar12;
    break;
  case CPPTYPE_STRING:
    __x = MapKey::GetStringValue(a);
    __y = MapKey::GetStringValue(b);
    bVar12 = std::operator<(__x,__y);
    return bVar12;
  }
  return bVar12;
}

Assistant:

bool operator()(const MapKey& a, const MapKey& b) const {
      ABSL_DCHECK(a.type() == b.type());
      switch (a.type()) {
#define CASE_TYPE(CppType, CamelCppType)                                \
  case FieldDescriptor::CPPTYPE_##CppType: {                            \
    return a.Get##CamelCppType##Value() < b.Get##CamelCppType##Value(); \
  }
        CASE_TYPE(STRING, String)
        CASE_TYPE(INT64, Int64)
        CASE_TYPE(INT32, Int32)
        CASE_TYPE(UINT64, UInt64)
        CASE_TYPE(UINT32, UInt32)
        CASE_TYPE(BOOL, Bool)
#undef CASE_TYPE

        default:
          ABSL_DLOG(FATAL) << "Invalid key for map field.";
          return true;
      }
    }